

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

void do_pop_up_string_proc(Am_Object *param_1)

{
  Am_Value_List *pAVar1;
  ostream *poVar2;
  Am_String local_58 [3];
  Am_Value_List local_40 [16];
  Am_Value_List local_30 [16];
  undefined1 local_20 [8];
  Am_Value v;
  Am_Object *param_0_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)param_1;
  Am_Value_List::Am_Value_List(local_40);
  pAVar1 = (Am_Value_List *)Am_Value_List::Add(local_40,"First line of message",1);
  Am_Value_List::Am_Value_List(local_30,pAVar1);
  Am_String::Am_String(local_58,"Initial value",true);
  Am_Get_Input_From_Dialog(local_20,local_30,local_58,0xffffd8f0,0xffffd8f0,1);
  Am_String::~Am_String(local_58);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Value_List::~Am_Value_List(local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,"Value returned is `");
  poVar2 = (ostream *)operator<<(poVar2,(Am_Value *)local_20);
  poVar2 = std::operator<<(poVar2,"\'\n");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_string, (Am_Object /*cmd*/))
{
  Am_Value v = Am_Get_Input_From_Dialog(
      Am_Value_List().Add("First line of message"), "Initial value");
  std::cout << "Value returned is `" << v << "'\n" << std::flush;
}